

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall
Json::Reader::decodeUnicodeEscapeSequence
          (Reader *this,Token *token,Location *current,Location end,uint *unicode)

{
  char *pcVar1;
  allocator local_99;
  string local_98;
  char local_71;
  int local_70;
  Char c;
  int index;
  allocator local_59;
  string local_58;
  uint *local_38;
  uint *unicode_local;
  Location end_local;
  Location *current_local;
  Token *token_local;
  Reader *this_local;
  
  local_38 = unicode;
  unicode_local = (uint *)end;
  end_local = (Location)current;
  current_local = (Location *)token;
  token_local = (Token *)this;
  if ((long)end - (long)*current < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_58,"Bad unicode escape sequence in string: four digits expected.",
               &local_59);
    this_local._7_1_ = addError(this,&local_58,(Token *)current_local,*(Location *)end_local);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  else {
    *unicode = 0;
    for (local_70 = 0; local_70 < 4; local_70 = local_70 + 1) {
      pcVar1 = *current;
      *current = pcVar1 + 1;
      local_71 = *pcVar1;
      *unicode = *unicode << 4;
      if ((local_71 < '0') || ('9' < local_71)) {
        if ((local_71 < 'a') || ('f' < local_71)) {
          if ((local_71 < 'A') || ('F' < local_71)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_98,
                       "Bad unicode escape sequence in string: hexadecimal digit expected.",
                       &local_99);
            this_local._7_1_ =
                 addError(this,&local_98,(Token *)current_local,*(Location *)end_local);
            std::__cxx11::string::~string((string *)&local_98);
            std::allocator<char>::~allocator((allocator<char> *)&local_99);
            goto LAB_009d80db;
          }
          *unicode = local_71 + -0x37 + *unicode;
        }
        else {
          *unicode = local_71 + -0x57 + *unicode;
        }
      }
      else {
        *unicode = local_71 + -0x30 + *unicode;
      }
    }
    this_local._7_1_ = 1;
  }
LAB_009d80db:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Reader::decodeUnicodeEscapeSequence(Token& token,
                                         Location& current,
                                         Location end,
                                         unsigned int& unicode) {
  if (end - current < 4)
    return addError(
        "Bad unicode escape sequence in string: four digits expected.",
        token,
        current);
  unicode = 0;
  for (int index = 0; index < 4; ++index) {
    Char c = *current++;
    unicode *= 16;
    if (c >= '0' && c <= '9')
      unicode += c - '0';
    else if (c >= 'a' && c <= 'f')
      unicode += c - 'a' + 10;
    else if (c >= 'A' && c <= 'F')
      unicode += c - 'A' + 10;
    else
      return addError(
          "Bad unicode escape sequence in string: hexadecimal digit expected.",
          token,
          current);
  }
  return true;
}